

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

int fio_defer_perform_single_task_for_queue(fio_task_queue_s *queue)

{
  fio_lock_i fVar1;
  fio_defer_queue_block_s *pfVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  fio_defer_queue_block_s *pfVar6;
  size_t sVar7;
  fio_defer_queue_block_s *pfVar8;
  _func_void_void_ptr_void_ptr *p_Var9;
  void *pvVar10;
  void *pvVar11;
  fio_lock_i ret;
  timespec local_38;
  
  LOCK();
  fVar1 = queue->lock;
  queue->lock = '\x01';
  UNLOCK();
  while (fVar1 != '\0') {
    local_38.tv_sec = 0;
    local_38.tv_nsec = 1;
    nanosleep(&local_38,(timespec *)0x0);
    LOCK();
    fVar1 = queue->lock;
    queue->lock = '\x01';
    UNLOCK();
  }
  pfVar2 = queue->reader;
  sVar3 = pfVar2->read;
  if ((pfVar2->write == sVar3) && (pfVar2->state == '\0')) {
    p_Var9 = (_func_void_void_ptr_void_ptr *)0x0;
    pvVar11 = (void *)0x0;
    pvVar10 = (void *)0x0;
  }
  else {
    sVar7 = sVar3 + 1;
    pfVar2->read = sVar7;
    p_Var9 = pfVar2->tasks[sVar3].func;
    pvVar10 = pfVar2->tasks[sVar3].arg2;
    if (sVar7 == 0xa8) {
      pfVar2->read = 0;
      pfVar2->state = '\0';
      sVar7 = 0;
    }
    pvVar11 = pfVar2->tasks[sVar3].arg1;
    if (pfVar2->write == sVar7) {
      pfVar8 = pfVar2;
      if (pfVar2->next == (fio_defer_queue_block_s *)0x0) {
        pfVar6 = &queue->static_queue;
        if ((pfVar2 == pfVar6) || ((queue->static_queue).state != '\x02')) {
          pfVar8 = (fio_defer_queue_block_s *)0x0;
          pfVar6 = pfVar2;
        }
        else {
          queue->writer = pfVar6;
          queue->reader = pfVar6;
        }
        pfVar6->write = 0;
        pfVar6->read = 0;
        pfVar6->state = '\0';
      }
      else {
        queue->reader = pfVar2->next;
      }
      if (pfVar8 == &queue->static_queue) {
        (queue->static_queue).state = '\x02';
        (queue->static_queue).next = (fio_defer_queue_block_s *)0x0;
        bVar4 = true;
      }
      else {
        bVar4 = false;
      }
      goto LAB_00106944;
    }
  }
  bVar4 = false;
  pfVar8 = (fio_defer_queue_block_s *)0x0;
LAB_00106944:
  LOCK();
  fVar1 = queue->lock;
  queue->lock = '\0';
  UNLOCK();
  local_38.tv_sec = CONCAT71(local_38.tv_sec._1_7_,fVar1);
  if (pfVar8 != (fio_defer_queue_block_s *)0x0 && !bVar4) {
    fio_free(pfVar8);
  }
  if (p_Var9 == (_func_void_void_ptr_void_ptr *)0x0) {
    iVar5 = -1;
  }
  else {
    (*p_Var9)(pvVar11,pvVar10);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static inline int
fio_defer_perform_single_task_for_queue(fio_task_queue_s *queue) {
  fio_defer_task_s task = fio_defer_pop_task(queue);
  if (!task.func)
    return -1;
  task.func(task.arg1, task.arg2);
  return 0;
}